

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_optimization.cc
# Opt level: O2

void __thiscall QPDF::ObjUser::ObjUser(ObjUser *this,user_e type)

{
  this->ou_type = type;
  this->pageno = 0;
  (this->key)._M_dataplus._M_p = (pointer)&(this->key).field_2;
  (this->key)._M_string_length = 0;
  (this->key).field_2._M_local_buf[0] = '\0';
  if (type == ou_root) {
    return;
  }
  __assert_fail("type == ou_root",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDF_optimization.cc"
                ,0xf,"QPDF::ObjUser::ObjUser(user_e)");
}

Assistant:

QPDF::ObjUser::ObjUser(user_e type) :
    ou_type(type)
{
    qpdf_assert_debug(type == ou_root);
}